

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CConnman::ThreadMessageHandler(CConnman *this)

{
  atomic<bool> *paVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  cv_status cVar5;
  long lVar6;
  byte bVar7;
  byte bVar8;
  mutex_type *pmVar9;
  long in_FS_OFFSET;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_68;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock83;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock83,&NetEventsInterface::g_msgproc_mutex,
             "NetEventsInterface::g_msgproc_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0xb96,false);
  paVar1 = &this->flagInterruptMsgProc;
  while (((paVar1->_M_base)._M_i & 1U) == 0) {
    NodesSnapshot::NodesSnapshot((NodesSnapshot *)&lock,this,true);
    uVar3 = lock.super_unique_lock._8_8_;
    bVar8 = 0;
    for (pmVar9 = lock.super_unique_lock._M_device; pmVar9 != (mutex_type *)uVar3;
        pmVar9 = (mutex_type *)((long)&(pmVar9->super___mutex_base)._M_mutex + 8)) {
      lVar6 = (pmVar9->super___mutex_base)._M_mutex.__align;
      if ((*(byte *)(lVar6 + 0x21a) & 1) == 0) {
        iVar4 = (*this->m_msgproc->_vptr_NetEventsInterface[3])(this->m_msgproc,lVar6,paVar1);
        if ((char)iVar4 == '\0') {
          bVar7 = 0;
        }
        else {
          bVar7 = *(byte *)(lVar6 + 0x241) ^ 1;
        }
        bVar8 = bVar7 | bVar8;
        if ((((paVar1->_M_base)._M_i & 1U) != 0) ||
           ((*this->m_msgproc->_vptr_NetEventsInterface[4])(this->m_msgproc,lVar6),
           ((paVar1->_M_base)._M_i & 1U) != 0)) break;
      }
    }
    NodesSnapshot::~NodesSnapshot((NodesSnapshot *)&lock.super_unique_lock);
    if (pmVar9 != (mutex_type *)uVar3) break;
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&lock.super_unique_lock,
               &this->mutexMsgProc,"mutexMsgProc",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
               ,0xbb3,false);
    if ((bVar8 & 1) == 0) {
      lVar6 = std::chrono::_V2::steady_clock::now();
      local_68.__d.__r = (duration)(lVar6 + 100000000);
      do {
        if (this->fMsgProcWake != false) break;
        cVar5 = std::condition_variable::
                __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                          (&this->condMsgProc,&lock.super_unique_lock,&local_68);
      } while (cVar5 != timeout);
    }
    this->fMsgProcWake = false;
    std::unique_lock<std::mutex>::~unique_lock(&lock.super_unique_lock);
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock83.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::ThreadMessageHandler()
{
    LOCK(NetEventsInterface::g_msgproc_mutex);

    while (!flagInterruptMsgProc)
    {
        bool fMoreWork = false;

        {
            // Randomize the order in which we process messages from/to our peers.
            // This prevents attacks in which an attacker exploits having multiple
            // consecutive connections in the m_nodes list.
            const NodesSnapshot snap{*this, /*shuffle=*/true};

            for (CNode* pnode : snap.Nodes()) {
                if (pnode->fDisconnect)
                    continue;

                // Receive messages
                bool fMoreNodeWork = m_msgproc->ProcessMessages(pnode, flagInterruptMsgProc);
                fMoreWork |= (fMoreNodeWork && !pnode->fPauseSend);
                if (flagInterruptMsgProc)
                    return;
                // Send messages
                m_msgproc->SendMessages(pnode);

                if (flagInterruptMsgProc)
                    return;
            }
        }

        WAIT_LOCK(mutexMsgProc, lock);
        if (!fMoreWork) {
            condMsgProc.wait_until(lock, std::chrono::steady_clock::now() + std::chrono::milliseconds(100), [this]() EXCLUSIVE_LOCKS_REQUIRED(mutexMsgProc) { return fMsgProcWake; });
        }
        fMsgProcWake = false;
    }
}